

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtHelper.cpp
# Opt level: O0

void VALIDATE_ENTER_CURRENT_THREAD(void)

{
  pthread_key_t __key;
  int iVar1;
  long lVar2;
  void *__pointer;
  
  if ((VALIDATE_ENTER_CURRENT_THREAD()::_has_init == '\0') &&
     (iVar1 = __cxa_guard_acquire(&VALIDATE_ENTER_CURRENT_THREAD()::_has_init), iVar1 != 0)) {
    VALIDATE_ENTER_CURRENT_THREAD::_has_init = InitializeProcess();
    __cxa_guard_release(&VALIDATE_ENTER_CURRENT_THREAD()::_has_init);
  }
  if ((VALIDATE_ENTER_CURRENT_THREAD::_has_init & 1U) != 0) {
    lVar2 = __tls_get_addr(&PTR_01e57de8);
    if ((*(byte *)(lVar2 + 0x50) & 1) == 0) {
      lVar2 = __tls_get_addr(&PTR_01e57de8);
      *(undefined1 *)(lVar2 + 0x50) = 1;
      Memory::HeapAllocator::InitializeThread();
      __key = s_threadLocalDummy;
      __pointer = malloc(1);
      pthread_setspecific(__key,__pointer);
    }
    return;
  }
  abort();
}

Assistant:

_NOINLINE void VALIDATE_ENTER_CURRENT_THREAD()
    {
        // We do also initialize the process part here
        // This is thread safe by the standard
        // Let's hope compiler doesn't fail
        static bool _has_init = InitializeProcess();

        if (!_has_init) // do not assert this.
        {
            abort();
        }

        if (s_threadWasEntered) return;
        s_threadWasEntered = true;

    #ifdef HEAP_TRACK_ALLOC
        HeapAllocator::InitializeThread();
    #endif

#ifndef _WIN32
        // put something into key to make sure destructor is going to be called
        pthread_setspecific(s_threadLocalDummy, malloc(1));
#endif
    }